

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.cpp
# Opt level: O0

void __thiscall Rational::normalize(Rational *this)

{
  bool bVar1;
  BigInteger a;
  BigInteger *in_stack_fffffffffffffed8;
  BigInteger *in_stack_fffffffffffffee0;
  BigInteger *in_stack_fffffffffffffee8;
  BigInteger *in_stack_fffffffffffffef0;
  BigInteger *in_stack_ffffffffffffff40;
  BigInteger *in_stack_ffffffffffffff48;
  BigInteger *in_stack_ffffffffffffff50;
  BigInteger *in_stack_ffffffffffffff58;
  
  BigInteger::BigInteger(in_stack_fffffffffffffef0,(longlong)in_stack_fffffffffffffee8);
  bVar1 = operator<(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  BigInteger::~BigInteger((BigInteger *)0x148f49);
  if (bVar1) {
    BigInteger::operator-(in_stack_fffffffffffffee8);
    BigInteger::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    BigInteger::~BigInteger((BigInteger *)0x148f94);
    BigInteger::operator-(in_stack_fffffffffffffee8);
    BigInteger::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    BigInteger::~BigInteger((BigInteger *)0x148fc9);
  }
  abs((int)&stack0xffffffffffffff48);
  BigInteger::BigInteger(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  gcd(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  BigInteger::~BigInteger((BigInteger *)0x14906b);
  BigInteger::~BigInteger((BigInteger *)0x149075);
  BigInteger::operator/=(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  BigInteger::operator/=(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  BigInteger::~BigInteger((BigInteger *)0x1490ab);
  return;
}

Assistant:

void Rational::normalize()
{
    if(_denominator < 0)
    {
        _denominator = -_denominator;
        _numerator = -_numerator;
    }
    BigInteger a = gcd(abs(_numerator), _denominator);
    _numerator /= a;
    _denominator /= a;
}